

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O3

void __thiscall BigNumber::BigNumber(BigNumber *this,int64_t num)

{
  pointer *ppcVar1;
  iterator __position;
  char *pcVar2;
  double dVar3;
  char *pcVar4;
  uint uVar5;
  uint uVar6;
  char local_31 [8];
  digit_t digit;
  
  this->_vptr_BigNumber = (_func_int **)&PTR__BigNumber_00105d98;
  (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  if (num < 0) {
    this->m_symbol = NEGATIVE;
    num = -num;
  }
  else {
    this->m_symbol = POSITIVE;
    if (num == 0) {
      uVar5 = 1;
      num = 0;
      goto LAB_00101795;
    }
  }
  dVar3 = log10((double)num);
  uVar5 = (uint)(dVar3 + 1.0);
  if ((int)uVar5 < 1) {
    return;
  }
LAB_00101795:
  uVar6 = uVar5;
  do {
    __position._M_current =
         (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<char,std::allocator<char>>::_M_realloc_insert<char_const&>
                ((vector<char,std::allocator<char>> *)&this->m_digits,__position,local_31);
    }
    else {
      *__position._M_current = (char)num + (char)((ulong)num / 10) * -10;
      ppcVar1 = &(this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish;
      *ppcVar1 = *ppcVar1 + 1;
    }
    uVar6 = uVar6 - 1;
    num = (ulong)num / 10;
  } while (uVar6 != 0);
  if (1 < uVar5) {
    pcVar2 = (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_start;
    pcVar4 = (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.
             super__Vector_impl_data._M_finish;
    while (pcVar4 != pcVar2) {
      pcVar4 = pcVar4 + -1;
      if (*pcVar4 != '\0') {
        return;
      }
      (this->m_digits).super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_finish = pcVar4;
    }
    this->m_symbol = ZERO;
  }
  return;
}

Assistant:

BigNumber::BigNumber(int64_t num)
{
    if (num<0)
    {
        m_symbol = NEGATIVE;
        num=-num;
    }
    else
        m_symbol = POSITIVE;
    int len = 1;
    if(num!=0)
        len=log10(num)+1;
    for (int i =0; i<len; ++i)
    {
        digit_t digit;
        digit=num%10;
        num=num/10;
        m_digits.push_back(digit);
    }
    if(len>1) {
        trim();
    }
}